

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  char cVar1;
  byte bVar2;
  uint8_t uVar3;
  LYS_NODE LVar4;
  ly_ctx *ctx;
  lyd_node *plVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  undefined4 extraout_var;
  char *pcVar10;
  long *plVar11;
  lys_node *last;
  lys_node *plVar12;
  size_t sVar13;
  char *pcVar14;
  lys_node *plVar15;
  ushort **ppuVar16;
  lys_module *plVar17;
  undefined4 extraout_var_00;
  ulong uVar18;
  lyd_node *plVar19;
  char *pcVar20;
  LY_VLOG_ELEM elem_type;
  int iVar21;
  lys_module *plVar22;
  LY_ECODE ecode;
  long lVar23;
  ulong uVar24;
  long *plVar25;
  size_t sVar26;
  uint *puVar27;
  LYS_NODE *pLVar28;
  hash_table *phVar29;
  lyd_node *plVar30;
  lys_node *local_e8;
  uint local_e0;
  undefined4 local_dc;
  long *local_d8;
  long *local_d0;
  char *local_c8;
  char *mod_name;
  char *local_b8;
  char *local_b0;
  char *name;
  uint local_a0;
  int local_9c;
  lyd_node *local_98;
  lyd_node *local_90;
  lys_node *local_88;
  int local_7c;
  int local_78;
  int mod_name_len;
  int nam_len;
  int has_predicate;
  ulong local_68;
  char *local_60;
  int local_54;
  ly_ctx *plStack_50;
  int is_relative;
  lys_module *local_48;
  int *local_40;
  long *local_38;
  
  local_54 = -1;
  local_a0 = options;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xa43,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  ctx = start->schema->module->ctx;
  uVar6 = parse_schema_nodeid(nodeid,&local_c8,&local_7c,&local_b0,&local_78,&local_54,(int *)0x0,
                              (int *)0x0,1);
  if ((int)uVar6 < 1) {
    local_b0 = nodeid + -uVar6;
    cVar1 = nodeid[-uVar6];
LAB_00113a0c:
    uVar18 = (ulong)(uint)(int)cVar1;
  }
  else {
    if (*local_b0 != '#') {
      local_54 = -1;
      local_68 = 0;
LAB_0011398a:
      uVar6 = parse_schema_nodeid(nodeid,&local_c8,&local_7c,&local_b0,&local_78,&local_54,
                                  &mod_name_len,(int *)0x0,0);
      if (0 < (int)uVar6) {
        local_60 = nodeid;
        plStack_50 = ctx;
        local_40 = parsed;
        if (local_54 == 0) {
          do {
            plVar30 = start;
            start = plVar30->parent;
          } while (plVar30->parent != (lyd_node *)0x0);
          local_48 = lyd_node_module(plVar30);
        }
        else {
          local_48 = lyd_node_module(start);
          if (((start->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
               LYS_UNKNOWN) || (plVar30 = start->child, plVar30 == (lyd_node *)0x0)) {
            return (lyd_node *)0x0;
          }
        }
        local_60 = local_60 + uVar6;
        pcVar10 = "";
        if (llist_value != (char *)0x0) {
          pcVar10 = llist_value;
        }
        local_98 = (lyd_node *)0x0;
        plVar11 = (long *)0x0;
        local_90 = plVar30;
        local_68 = (ulong)((int)local_68 + uVar6);
        do {
          free(plVar11);
          lVar23 = 0;
          plVar11 = (long *)0x0;
          sVar26 = 0;
          uVar18 = local_68;
          while (plVar30 = local_90, mod_name_len != 0) {
            plVar11 = (long *)ly_realloc(plVar11,sVar26 + 0x30);
            pcVar20 = local_60;
            if (plVar11 == (long *)0x0) goto LAB_0011434d;
            uVar6 = parse_schema_json_predicate
                              (local_60,(char **)((long)plVar11 + sVar26),
                               (int *)((long)plVar11 + sVar26 + 8),
                               (char **)((long)plVar11 + sVar26 + 0x10),
                               (int *)((long)plVar11 + sVar26 + 0x18),
                               (char **)((long)plVar11 + sVar26 + 0x20),
                               (int *)((long)plVar11 + sVar26 + 0x28),&mod_name_len);
            if ((int)uVar6 < 1) {
              ly_vlog(plStack_50,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*pcVar20
                      ,pcVar20);
              parsed = local_40;
              goto LAB_00113a1f;
            }
            local_60 = pcVar20 + uVar6;
            uVar18 = (ulong)((int)uVar18 + uVar6);
            lVar23 = lVar23 + -1;
            sVar26 = sVar26 + 0x30;
          }
          if (local_90->parent == (lyd_node *)0x0) {
            plVar15 = (lys_node *)0x0;
          }
          else {
            plVar15 = local_90->parent->schema;
          }
          plVar22 = (lys_module *)-lVar23;
          last = (lys_node *)0x0;
          local_68 = uVar18;
          local_38 = plVar11;
LAB_00113b50:
          do {
            last = lys_getnext(last,plVar15,local_48,0);
            plVar11 = local_38;
            plVar19 = local_98;
            if (last == (lys_node *)0x0) goto LAB_00113a26;
            if ((plVar15 != (lys_node *)0x0) &&
               ((plVar15->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN)) {
              plVar12 = lys_parent(last);
              if ((local_a0 & 4) == 0) {
                if (plVar12->nodetype == LYS_OUTPUT) goto LAB_00113b50;
              }
              else if (plVar12->nodetype == LYS_INPUT) goto LAB_00113b50;
            }
            iVar7 = schema_nodeid_siblingcheck(last,local_48,local_c8,local_7c,local_b0,local_78);
            pcVar20 = local_60;
          } while (iVar7 != 0);
          LVar4 = last->nodetype;
          if (((lVar23 == 0) && (*local_60 == '\0')) &&
             (plVar22 = (lys_module *)0x0, LVar4 == LYS_LEAFLIST)) {
            plVar11 = (long *)calloc(1,0x30);
            if (plVar11 == (long *)0x0) {
LAB_0011434d:
              ly_log(plStack_50,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "resolve_partial_json_data_nodeid");
              plVar11 = (long *)0x0;
              parsed = local_40;
            }
            else {
              plVar11[2] = (long)".";
              *(undefined4 *)(plVar11 + 3) = 1;
              plVar11[4] = (long)pcVar10;
              sVar13 = strlen(pcVar10);
              *(int *)(plVar11 + 5) = (int)sVar13;
LAB_00113c4b:
              pcVar14 = (char *)plVar11[2];
              uVar6 = (uint)*pcVar14;
              if ((uVar6 == 0x2e) && ((int)plVar11[3] == 1)) {
                local_38 = plVar11;
                if ((*(int *)&last[1].ref != 7) ||
                   (pcVar14 = strnchr((char *)plVar11[4],0x3a,*(uint *)(plVar11 + 5)),
                   pcVar14 != (char *)0x0)) {
                  local_48 = (lys_module *)0x1;
                  pLVar28 = &last->nodetype;
                  goto LAB_00113d4f;
                }
                uVar6 = *(uint *)(local_38 + 5);
                pcVar14 = (char *)local_38[4];
                ecode = LYE_PATH_INIDENTREF;
                elem_type = LY_VLOG_LYS;
                plVar11 = local_38;
              }
              else {
                ecode = LYE_PATH_INCHAR;
                elem_type = LY_VLOG_NONE;
                last = (lys_node *)0x0;
              }
              ly_vlog(plStack_50,ecode,elem_type,last,(ulong)uVar6,pcVar14);
              parsed = local_40;
            }
            goto LAB_00113a1f;
          }
          pLVar28 = &last->nodetype;
          uVar6 = (uint)plVar22;
          local_48 = plVar22;
          if ((LVar4 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            if (uVar6 < 2) {
              plVar11 = local_38;
              if (uVar6 == 0) {
                local_48 = (lys_module *)0x0;
                goto LAB_00113d4f;
              }
              goto LAB_00113c4b;
            }
LAB_0011443e:
            ly_vlog(plStack_50,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
            plVar11 = local_38;
            parsed = local_40;
            goto LAB_00113a1f;
          }
          if (LVar4 == LYS_LIST) {
            if (uVar6 == 0) {
              return local_98;
            }
            ppuVar16 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar16 + (long)*(char *)local_38[2] * 2 + 1) & 8) == 0) {
              if ((uint)last->padding[2] < (uint)local_48) goto LAB_0011443e;
              uVar18 = (ulong)local_48 & 0xffffffff;
              _nam_len = pLVar28;
              if ((uint)local_48 < (uint)last->padding[2]) {
                ly_vlog(plStack_50,LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,
                        **(undefined8 **)(*(long *)&last[1].flags + uVar18 * 8));
                plVar11 = local_38;
                parsed = local_40;
                goto LAB_00113a1f;
              }
              puVar27 = (uint *)(local_38 + 5);
              for (uVar24 = 0; pcVar20 = local_60, pLVar28 = _nam_len, uVar18 != uVar24;
                  uVar24 = uVar24 + 1) {
                if ((*(int *)(*(long *)(*(long *)&last[1].flags + uVar24 * 8) + 0x80) == 7) &&
                   (pcVar20 = strnchr(*(char **)(puVar27 + -2),0x3a,*puVar27),
                   pcVar20 == (char *)0x0)) {
                  ly_vlog(plStack_50,LYE_PATH_INIDENTREF,LY_VLOG_LYS,
                          *(void **)(*(long *)&last[1].flags + uVar24 * 8),(ulong)*puVar27,
                          *(undefined8 *)(puVar27 + -2));
                  plVar11 = local_38;
                  parsed = local_40;
                  goto LAB_00113a1f;
                }
                puVar27 = puVar27 + 0xc;
              }
            }
          }
          else {
            if (local_38 != (long *)0x0) goto LAB_0011443e;
            local_38 = (long *)0x0;
          }
LAB_00113d4f:
          plVar19 = plVar30->parent;
          if ((plVar19 == (lyd_node *)0x0) || (plVar19->ht == (hash_table *)0x0)) goto LAB_00113e82;
          if (*pLVar28 == LYS_LEAFLIST) {
            bVar2 = (byte)last->flags & 1;
joined_r0x00113e7c:
            if (bVar2 == 0) {
LAB_00113e82:
              local_9c = 0;
              do {
                plVar11 = local_38;
                plVar19 = local_98;
                if (plVar30 == (lyd_node *)0x0) goto LAB_00113a26;
                plVar15 = lys_parent(plVar30->schema);
                if (plVar15 != (lys_node *)0x0) {
                  plVar15 = lys_parent(plVar30->schema);
                  if ((local_a0 & 4) == 0) {
                    if (plVar15->nodetype == LYS_OUTPUT) {
                      pcVar10 = plVar30->schema->name;
                      pcVar20 = "Provided data tree includes some RPC output nodes (%s).";
LAB_001143fb:
                      ly_log(plStack_50,LY_LLERR,LY_EINVAL,pcVar20,pcVar10);
                      plVar11 = local_38;
                      parsed = local_40;
                      goto LAB_00113a1f;
                    }
                  }
                  else if (plVar15->nodetype == LYS_INPUT) {
                    pcVar10 = plVar30->schema->name;
                    pcVar20 = "Provided data tree includes some RPC input nodes (%s).";
                    goto LAB_001143fb;
                  }
                }
                plVar15 = plVar30->schema;
                if (plVar15 == last) {
                  iVar7 = (int)local_68;
                  if (*pLVar28 == LYS_LIST) {
                    if (plVar15->nodetype != LYS_LIST) {
                      __assert_fail("node->schema->nodetype == LYS_LIST",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                                    ,0x9e5,
                                    "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                                   );
                    }
                    if ((int)local_48 == 0) {
                      __assert_fail("pp.len",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                                    ,0x9e6,
                                    "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                                   );
                    }
                    iVar21 = local_9c + 1;
                    name = (char *)plVar15->module->ctx;
                    local_88 = plVar15;
                    ppuVar16 = __ctype_b_loc();
                    local_9c = iVar21;
                    if ((*(byte *)((long)*ppuVar16 + (long)*(char *)local_38[2] * 2 + 1) & 8) == 0)
                    {
                      plVar19 = plVar30->child;
                      if (plVar19 != (lyd_node *)0x0) {
                        pcVar14 = (char *)0x0;
                        plVar25 = local_38;
                        local_90 = plVar30;
                        _nam_len = pLVar28;
                        do {
                          pcVar20 = local_60;
                          pLVar28 = _nam_len;
                          if ((char *)(ulong)local_88->padding[2] <= pcVar14) goto LAB_001142a1;
                          pcVar20 = plVar19->schema->name;
                          local_b8 = (char *)plVar25[2];
                          lVar23 = plVar25[3];
                          mod_name = pcVar14;
                          iVar7 = strncmp(pcVar20,local_b8,(long)(int)lVar23);
                          pcVar14 = local_b8;
                          if ((iVar7 != 0) || (pcVar20[(int)lVar23] != '\0')) {
LAB_001143d6:
                            ly_vlog((ly_ctx *)name,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcVar14);
                            plVar11 = local_38;
                            parsed = local_40;
                            goto LAB_00113a1f;
                          }
                          lVar23 = *plVar25;
                          plVar22 = lyd_node_module(plVar19);
                          plVar30 = local_90;
                          if (lVar23 != 0) {
                            iVar7 = strncmp(plVar22->name,(char *)*plVar25,(long)(int)plVar25[1]);
                            plVar30 = local_90;
                            if ((iVar7 == 0) &&
                               (plVar22 = lyd_node_module(plVar19),
                               plVar22->name[(int)plVar25[1]] == '\0')) {
                              plVar22 = lyd_node_module(plVar19);
                              plVar17 = lyd_node_module(plVar30);
                              if (plVar22 != plVar17) goto LAB_001140a4;
                            }
LAB_001143ac:
                            pcVar14 = (char *)plVar25[2];
                            goto LAB_001143d6;
                          }
                          plVar17 = lyd_node_module(local_90);
                          if (plVar22 != plVar17) goto LAB_001143ac;
LAB_001140a4:
                          pcVar20 = lyd_make_canonical(plVar19->schema,(char *)plVar25[4],
                                                       (int)plVar25[5]);
                          plVar11 = local_38;
                          parsed = local_40;
                          if (pcVar20 == (char *)0x0) goto LAB_00113a1f;
                          iVar7 = strcmp((char *)plVar19->ht,pcVar20);
                          local_b8 = (char *)CONCAT44(local_b8._4_4_,iVar7);
                          free(pcVar20);
                          pcVar20 = local_60;
                          pLVar28 = _nam_len;
                          if ((int)local_b8 != 0) break;
                          plVar19 = plVar19->next;
                          pcVar14 = mod_name + 1;
                          plVar25 = plVar25 + 6;
                        } while( true );
                      }
                    }
                    else {
                      iVar9 = atoi((char *)local_38[2]);
                      iVar7 = (int)local_68;
                      if (iVar9 == iVar21) goto LAB_001142b1;
                    }
                  }
                  else {
                    if (*pLVar28 != LYS_LEAFLIST) goto LAB_001142b1;
                    if ((last->flags & 2) == 0) {
                      if ((local_38 == (long *)0x0) ||
                         (pcVar14 = (char *)local_38[4], pcVar14 == (char *)0x0)) {
                        if (plVar30->ht == (hash_table *)0x0) goto LAB_001142b1;
                        uVar3 = (uint8_t)plVar30->ht->used;
                      }
                      else {
                        plVar15 = (lys_node *)(long)(int)local_38[5];
                        mod_name = pcVar14;
                        pcVar20 = strchr(pcVar14,0x3a);
                        if ((pcVar20 == (char *)0x0) && (((ulong)plVar30[1].schema & 7) != 0)) {
                          local_88 = (lys_node *)plVar30->ht;
                          plVar22 = lyd_node_module(plVar30);
                          pcVar20 = plVar22->name;
                          plVar22 = lyd_node_module(plVar30);
                          sVar13 = strlen(plVar22->name);
                          iVar7 = strncmp((char *)local_88,pcVar20,sVar13);
                          if (iVar7 != 0) goto LAB_00113f31;
                          phVar29 = plVar30->ht;
                          local_88 = plVar15;
                          plVar22 = lyd_node_module(plVar30);
                          sVar13 = strlen(plVar22->name);
                          plVar15 = local_88;
                          if (*(char *)((long)&phVar29->used + sVar13) != ':') goto LAB_00113f31;
                          phVar29 = plVar30->ht;
                          plVar22 = lyd_node_module(plVar30);
                          sVar13 = strlen(plVar22->name);
                          phVar29 = (hash_table *)((long)&phVar29->used + sVar13 + 1);
                          plVar15 = local_88;
                        }
                        else {
LAB_00113f31:
                          phVar29 = plVar30->ht;
                        }
                        iVar7 = strncmp(mod_name,(char *)phVar29,(size_t)plVar15);
                        pcVar20 = local_60;
                        if (iVar7 != 0) goto LAB_00113ed5;
                        uVar3 = plVar15->padding[(long)((long)&phVar29[-1].val_equal + 4)];
                        iVar7 = (int)local_68;
                      }
                      if (uVar3 == '\0') goto LAB_001142b1;
                    }
                  }
                }
LAB_00113ed5:
                plVar30 = plVar30->next;
              } while( true );
            }
          }
          else if (*pLVar28 == LYS_LIST) {
            bVar2 = last->padding[2];
            goto joined_r0x00113e7c;
          }
          local_e0 = (uint)local_48;
          local_dc = 0;
          local_d0 = (long *)0x0;
          local_d8 = local_38;
          local_e8 = last;
          _nam_len = pLVar28;
          if (plVar19->hash == 0) {
            __assert_fail("parent && parent->hash",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x4d1,
                          "struct lyd_node *resolve_json_data_node_hash(struct lyd_node *, struct parsed_pred)"
                         );
          }
          local_48 = (lys_module *)lyht_set_cb(plVar19->ht,resolve_hash_table_find_equal);
          plVar15 = local_e8;
          plVar22 = lys_node_module(local_e8);
          pcVar20 = plVar22->name;
          plVar22 = lys_node_module(plVar15);
          sVar13 = strlen(plVar22->name);
          uVar8 = dict_hash_multi(0,pcVar20,sVar13);
          pcVar20 = plVar15->name;
          sVar13 = strlen(pcVar20);
          uVar8 = dict_hash_multi(uVar8,pcVar20,sVar13);
          pcVar20 = local_60;
          if (plVar15->nodetype == LYS_LEAFLIST) {
            if (((local_e0 != 1) || (*(char *)local_d8[2] != '.')) || ((int)local_d8[3] != 1)) {
              __assert_fail("(pp.len == 1) && (pp.pred[0].name[0] == \'.\') && (pp.pred[0].nam_len == 1)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                            ,0x4da,
                            "struct lyd_node *resolve_json_data_node_hash(struct lyd_node *, struct parsed_pred)"
                           );
            }
            uVar8 = dict_hash_multi(uVar8,(char *)local_d8[4],(long)(int)local_d8[5]);
          }
          else if (plVar15->nodetype == LYS_LIST) {
            uVar18 = (ulong)local_e0;
            if ((int)local_e0 < 1) {
              uVar18 = 0;
            }
            for (lVar23 = 0; uVar18 * 0x30 - lVar23 != 0; lVar23 = lVar23 + 0x30) {
              uVar8 = dict_hash_multi(uVar8,*(char **)((long)local_d8 + lVar23 + 0x20),
                                      (long)*(int *)((long)local_d8 + lVar23 + 0x28));
            }
          }
          pLVar28 = _nam_len;
          uVar8 = dict_hash_multi(uVar8,(char *)0x0,0);
          iVar7 = lyht_find(plVar19->ht,&local_e8,uVar8,&local_d0);
          if (iVar7 == 0) {
            if (*local_d0 == 0) {
              __assert_fail("i || *ret",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                            ,0x4e7,
                            "struct lyd_node *resolve_json_data_node_hash(struct lyd_node *, struct parsed_pred)"
                           );
            }
            lyht_set_cb(plVar19->ht,(values_equal_cb)local_48);
            plVar30 = (lyd_node *)*local_d0;
          }
          else {
            lyht_set_cb(plVar19->ht,(values_equal_cb)local_48);
            plVar30 = (lyd_node *)0x0;
          }
LAB_001142a1:
          iVar7 = (int)local_68;
          plVar11 = local_38;
          plVar19 = local_98;
          if (plVar30 == (lyd_node *)0x0) goto LAB_00113a26;
LAB_001142b1:
          parsed = local_40;
          *local_40 = *local_40 + iVar7;
          local_48 = lyd_node_module(plVar30);
          plVar11 = local_38;
          plVar19 = plVar30;
          if ((int)*pcVar20 == 0) goto LAB_00113a26;
          if ((*pLVar28 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            ly_vlog(plStack_50,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*pcVar20,
                    pcVar20);
            plVar11 = local_38;
            goto LAB_00113a1f;
          }
          plVar5 = plVar30->child;
          if (plVar5 == (lyd_node *)0x0) goto LAB_00113a26;
          uVar6 = parse_schema_nodeid(pcVar20,&local_c8,&local_7c,&local_b0,&local_78,&local_54,
                                      &mod_name_len,(int *)0x0,0);
          if ((int)uVar6 < 1) goto LAB_00114499;
          local_60 = pcVar20 + uVar6;
          plVar11 = local_38;
          local_98 = plVar30;
          local_90 = plVar5;
          local_68 = CONCAT44(extraout_var_00,uVar6);
        } while( true );
      }
      local_b0 = nodeid + -uVar6;
      cVar1 = nodeid[-uVar6];
      goto LAB_00113a0c;
    }
    if (local_54 == 0) {
      nodeid = nodeid + uVar6;
      local_68 = CONCAT44(extraout_var,uVar6);
      goto LAB_0011398a;
    }
    uVar18 = 0x23;
  }
  ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar18,local_b0);
  plVar11 = (long *)0x0;
LAB_00113a1f:
  *parsed = -1;
  plVar19 = (lyd_node *)0x0;
LAB_00113a26:
  free(plVar11);
  return plVar19;
LAB_00114499:
  ly_vlog(plStack_50,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)pcVar20[-uVar6],
          pcVar20 + -uVar6);
  plVar11 = local_38;
  parsed = local_40;
  goto LAB_00113a1f;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    const char *id, *mod_name, *name, *data_val, *llval;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed = 0, llval_len;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prev_mod;
    struct ly_ctx *ctx;
    const struct lys_node *ssibling, *sparent;
    struct lys_node_list *slist;
    struct parsed_pred pp;

    assert(nodeid && start && parsed);

    memset(&pp, 0, sizeof pp);
    ctx = start->schema->module->ctx;
    id = nodeid;

    /* parse first nodeid in case it is yang-data extension */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            goto error;
        }
        id += r;
        last_parsed = r;
    } else {
        is_relative = -1;
    }

    /* parse first nodeid */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed += r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = (start->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) ? start->child : NULL;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }
    if (!start) {
        /* there are no siblings to search */
        return NULL;
    }

    /* do not duplicate code, use predicate parsing from the loop */
    goto parse_predicates;

    while (1) {
        /* find the correct schema node first */
        ssibling = NULL;
        sparent = (start && start->parent) ? start->parent->schema : NULL;
        while ((ssibling = lys_getnext(ssibling, sparent, prev_mod, 0))) {
            /* skip invalid input/output nodes */
            if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(ssibling)->nodetype == LYS_INPUT) {
                        continue;
                    }
                } else {
                    if (lys_parent(ssibling)->nodetype == LYS_OUTPUT) {
                        continue;
                    }
                }
            }

            if (!schema_nodeid_siblingcheck(ssibling, prev_mod, mod_name, mod_name_len, name, nam_len)) {
                break;
            }
        }
        if (!ssibling) {
            /* there is not even such a schema node */
            free(pp.pred);
            return last_match;
        }
        pp.schema = ssibling;

        /* unify leaf-list value - it is possible to specify last-node value as both a predicate or parameter if
         * is a leaf-list, unify both cases and the value will in both cases be in the predicate structure */
        if (!id[0] && !pp.len && (ssibling->nodetype == LYS_LEAFLIST)) {
            pp.len = 1;
            pp.pred = calloc(1, sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);

            pp.pred[0].name = ".";
            pp.pred[0].nam_len = 1;
            pp.pred[0].value = (llist_value ? llist_value : "");
            pp.pred[0].val_len = strlen(pp.pred[0].value);
        }

        if (ssibling->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
            /* check leaf/leaf-list predicate */
            if (pp.len > 1) {
                LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                goto error;
            } else if (pp.len) {
                if ((pp.pred[0].name[0] != '.') || (pp.pred[0].nam_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, pp.pred[0].name[0], pp.pred[0].name);
                    goto error;
                }
                if ((((struct lys_node_leaf *)ssibling)->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[0].value, ':', pp.pred[0].val_len)) {
                    LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, ssibling, pp.pred[0].val_len, pp.pred[0].value);
                    goto error;
                }
            }
        } else if (ssibling->nodetype == LYS_LIST) {
            /* list should have predicates for all the keys or position */
            slist = (struct lys_node_list *)ssibling;
            if (!pp.len) {
                /* none match */
                return last_match;
            } else if (!isdigit(pp.pred[0].name[0])) {
                /* list predicate is not a position, so there must be all the keys */
                if (pp.len > slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                    goto error;
                } else if (pp.len < slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, slist->keys[pp.len]->name);
                    goto error;
                }
                /* check that all identityrefs have module name, otherwise the hash of the list instance will never match!! */
                for (r = 0; r < pp.len; ++r) {
                    if ((slist->keys[r]->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[r].value, ':', pp.pred[r].val_len)) {
                        LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, slist->keys[r], pp.pred[r].val_len, pp.pred[r].value);
                        goto error;
                    }
                }
            }
        } else if (pp.pred) {
            /* no other nodes allow predicates */
            LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
            goto error;
        }

#ifdef LY_ENABLED_CACHE
        /* we will not be matching keyless lists or state leaf-lists this way */
        if (start->parent && start->parent->ht && ((pp.schema->nodetype != LYS_LIST) || ((struct lys_node_list *)pp.schema)->keys_size)
                && ((pp.schema->nodetype != LYS_LEAFLIST) || (pp.schema->flags & LYS_CONFIG_W))) {
            sibling = resolve_json_data_node_hash(start->parent, pp);
        } else
#endif
        {
            list_instance_position = 0;
            LY_TREE_FOR(start, sibling) {
                /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
                if (lys_parent(sibling->schema)) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    } else {
                        if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    }
                }

                if (sibling->schema != ssibling) {
                    /* wrong schema node */
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (ssibling->nodetype == LYS_LEAFLIST) {
                    if (ssibling->flags & LYS_CONFIG_R) {
                        /* state leaf-lists will never match */
                        continue;
                    }

                    llist = (struct lyd_node_leaf_list *)sibling;

                    /* get the expected leaf-list value */
                    llval = NULL;
                    llval_len = 0;
                    if (pp.pred) {
                        /* it was already checked that it is correct */
                        llval = pp.pred[0].value;
                        llval_len = pp.pred[0].val_len;

                    }

                    /* make value canonical (remove module name prefix) unless it was specified with it */
                    if (llval && !strchr(llval, ':') && (llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llval && data_val && data_val[0]) || (llval && (strncmp(llval, data_val, llval_len)
                            || data_val[llval_len]))) {
                        continue;
                    }

                } else if (ssibling->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    ++list_instance_position;
                    ret = resolve_partial_json_data_list_predicate(pp, sibling, list_instance_position);
                    if (ret == -1) {
                        goto error;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                }

                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            free(pp.pred);
            return last_match;
        }

        /* we found a next matching node */
        *parsed += last_parsed;
        last_match = sibling;
        prev_mod = lyd_node_module(sibling);

        /* the result node? */
        if (!id[0]) {
            free(pp.pred);
            return last_match;
        }

        /* move down the tree, if possible, and continue */
        if (ssibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            /* there can be no children even through expected, error */
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
            goto error;
        } else if (!sibling->child) {
            /* there could be some children, but are not, return what we found so far */
            free(pp.pred);
            return last_match;
        }
        start = sibling->child;

        /* parse nodeid */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            goto error;
        }
        id += r;
        last_parsed = r;

parse_predicates:
        /* parse all the predicates */
        free(pp.pred);
        pp.schema = NULL;
        pp.len = 0;
        pp.pred = NULL;
        while (has_predicate) {
            ++pp.len;
            pp.pred = ly_realloc(pp.pred, pp.len * sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);
            if ((r = parse_schema_json_predicate(id, &pp.pred[pp.len - 1].mod_name, &pp.pred[pp.len - 1].mod_name_len,
                                                 &pp.pred[pp.len - 1].name, &pp.pred[pp.len - 1].nam_len, &pp.pred[pp.len - 1].value,
                                                 &pp.pred[pp.len - 1].val_len, &has_predicate)) < 1) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                goto error;
            }

            id += r;
            last_parsed += r;
        }
    }

error:
    *parsed = -1;
    free(pp.pred);
    return NULL;
}